

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O3

bool __thiscall re2::Compiler::IsCachedRuneByteSuffix(Compiler *this,int id)

{
  Inst *pIVar1;
  ulong uVar2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  _Rb_tree_header *p_Var5;
  _Base_ptr p_Var6;
  
  pIVar1 = this->inst_;
  if ((pIVar1[id].out_opcode_ & 7) != 2) {
    __assert_fail("(opcode()) == (kInstByteRange)",
                  "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/prog.h",0x71
                  ,"int re2::Prog::Inst::foldcase()");
  }
  p_Var3 = (this->rune_cache_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var5 = &(this->rune_cache_)._M_t._M_impl.super__Rb_tree_header;
  p_Var6 = &p_Var5->_M_header;
  if (p_Var3 != (_Base_ptr)0x0) {
    uVar2 = (ulong)(pIVar1[id].field_1.field_3.foldcase_ != '\0') |
            ((ulong)pIVar1[id].field_1.field_3.lo_ << 9 |
            (ulong)(pIVar1[id].out_opcode_ >> 4) << 0x11) +
            (ulong)pIVar1[id].field_1.field_3.hi_ * 2;
    p_Var4 = &p_Var5->_M_header;
    do {
      if (*(ulong *)(p_Var3 + 1) >= uVar2) {
        p_Var4 = p_Var3;
      }
      p_Var3 = (&p_Var3->_M_left)[*(ulong *)(p_Var3 + 1) < uVar2];
    } while (p_Var3 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var4 != p_Var5) && (p_Var6 = p_Var4, uVar2 < *(ulong *)(p_Var4 + 1)))
    {
      p_Var6 = &p_Var5->_M_header;
    }
  }
  return (_Rb_tree_header *)p_Var6 != p_Var5;
}

Assistant:

bool Compiler::IsCachedRuneByteSuffix(int id) {
  uint8 lo = inst_[id].lo_;
  uint8 hi = inst_[id].hi_;
  bool foldcase = inst_[id].foldcase() != 0;
  int next = inst_[id].out();

  uint64 key = MakeRuneCacheKey(lo, hi, foldcase, next);
  return rune_cache_.find(key) != rune_cache_.end();
}